

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-app.h
# Opt level: O3

void __thiscall
mp::SolverApp<MultiObjTestSolver<2>,_MockNLReader<MultiObjTestSolver<2>_>_>::ReadNL
          (SolverApp<MultiObjTestSolver<2>,_MockNLReader<MultiObjTestSolver<2>_>_> *this,
          int nl_reader_flags)

{
  SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>
  *pSVar1;
  Argument1 gmock_a1;
  MockProblemBuilder *this_00;
  SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>
  *pSVar2;
  time_point start;
  time_point local_70;
  _Any_data local_68;
  code *local_58;
  undefined8 uStack_50;
  double local_48 [3];
  ArgList local_30;
  
  local_70.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  this_00 = (MockProblemBuilder *)operator_new(0x1c48);
  MockProblemBuilder::MockProblemBuilder(this_00);
  std::__uniq_ptr_impl<MultiObjMockProblemBuilder,_std::default_delete<MultiObjMockProblemBuilder>_>
  ::reset((__uniq_ptr_impl<MultiObjMockProblemBuilder,_std::default_delete<MultiObjMockProblemBuilder>_>
           *)&this->builder_,(pointer)this_00);
  pSVar2 = (SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>
            *)operator_new(0x88);
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_58 = (code *)0x0;
  uStack_50 = 0;
  (pSVar2->super_NLProblemBuilder<MultiObjMockProblemBuilder>).builder_ =
       (this->builder_)._M_t.
       super___uniq_ptr_impl<MultiObjMockProblemBuilder,_std::default_delete<MultiObjMockProblemBuilder>_>
       ._M_t.
       super__Tuple_impl<0UL,_MultiObjMockProblemBuilder_*,_std::default_delete<MultiObjMockProblemBuilder>_>
       .super__Head_base<0UL,_MultiObjMockProblemBuilder_*,_false>._M_head_impl;
  (pSVar2->super_NLProblemBuilder<MultiObjMockProblemBuilder>)._vptr_NLProblemBuilder =
       (_func_int **)&PTR__SolverNLHandlerImpl_00290ba0;
  pSVar2->solver_ = &this->solver_;
  pSVar2->num_options_ = 0;
  std::function<void_()>::function(&pSVar2->after_header_,(function<void_()> *)&local_68);
  pSVar1 = (this->handler_)._M_t.
           super___uniq_ptr_impl<mp::internal::SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>,_std::default_delete<mp::internal::SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_mp::internal::SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>_*,_std::default_delete<mp::internal::SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>_>_>
           .
           super__Head_base<0UL,_mp::internal::SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>_*,_false>
           ._M_head_impl;
  (this->handler_)._M_t.
  super___uniq_ptr_impl<mp::internal::SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>,_std::default_delete<mp::internal::SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_mp::internal::SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>_*,_std::default_delete<mp::internal::SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>_>_>
  .
  super__Head_base<0UL,_mp::internal::SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>_*,_false>
  ._M_head_impl = pSVar2;
  if (pSVar1 != (SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>
                 *)0x0) {
    (**(code **)((long)(pSVar1->super_NLProblemBuilder<MultiObjMockProblemBuilder>).
                       _vptr_NLProblemBuilder + 8))();
  }
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  gmock_a1.data_ = (this->nl_filename)._M_dataplus._M_p;
  gmock_a1.size_ = (this->nl_filename)._M_string_length;
  MockNLReader<MultiObjTestSolver<2>_>::DoRead
            (&this->super_MockNLReader<MultiObjTestSolver<2>_>,gmock_a1,
             (this->handler_)._M_t.
             super___uniq_ptr_impl<mp::internal::SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>,_std::default_delete<mp::internal::SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_mp::internal::SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>_*,_std::default_delete<mp::internal::SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>_>_>
             .
             super__Head_base<0UL,_mp::internal::SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>_*,_false>
             ._M_head_impl,nl_reader_flags);
  local_48[0] = GetTimeAndReset(&local_70);
  if ((this->solver_).super_SolverImpl<MultiObjMockProblemBuilder>.super_Solver.super_BasicSolver.
      timing_ != 0) {
    local_30.field_1.values_ = (Value *)local_48;
    local_30.types_ = 8;
    BasicSolver::Print((BasicSolver *)&this->solver_,(CStringRef)0x21a575,&local_30);
  }
  return;
}

Assistant:

void SolverApp<Solver, Reader>::ReadNL(int nl_reader_flags) {
  std::chrono::steady_clock::time_point start = std::chrono::steady_clock::now();

  builder_.reset(new ProblemBuilder(solver_));
  handler_.reset(new internal::SolverNLHandler<Solver>(*builder_, solver_));
  this->Read(nl_filename, *handler_, nl_reader_flags);

  double read_time = GetTimeAndReset(start);
  if (solver_.timing())
    solver_.Print("Input time = {:.6f}s\n", read_time);
}